

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

bool __thiscall IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IRBuilderAsmJs *this,Instr *instr)

{
  StackSym *pSVar1;
  bool bVar2;
  Opnd *this_00;
  RegOpnd *pRVar3;
  JitLoopBodyData *this_01;
  StackSym *pSVar4;
  bool local_21;
  Opnd *dst;
  Instr *instr_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  local_21 = false;
  if (this_00 != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    local_21 = false;
    if (bVar2) {
      pRVar3 = IR::Opnd::AsRegOpnd(this_00);
      pSVar1 = pRVar3->m_sym;
      this_01 = GetJitLoopBodyData(this);
      pSVar4 = JitLoopBodyData::GetLoopBodyRetIPSym(this_01);
      local_21 = pSVar1 == pSVar4;
    }
  }
  return local_21;
}

Assistant:

bool
IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
    IR::Opnd * dst = instr->GetDst();
    return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == GetJitLoopBodyData().GetLoopBodyRetIPSym());
}